

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O2

MeshAttributeIndicesEncodingData * __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::
GetAttributeEncodingData
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder> *this,
          int att_id)

{
  pointer pAVar1;
  pointer puVar2;
  __uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  _Var3;
  int iVar4;
  MeshAttributeIndicesEncodingData *pMVar5;
  MeshAttributeIndicesEncodingData *pMVar6;
  MeshAttributeIndicesEncodingData *pMVar7;
  int iVar8;
  uint uVar9;
  MeshAttributeIndicesEncodingData *pMVar10;
  
  uVar9 = 0;
  do {
    pMVar10 = (MeshAttributeIndicesEncodingData *)(ulong)uVar9;
    pAVar1 = (this->attribute_data_).
             super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar5 = (MeshAttributeIndicesEncodingData *)
             (((long)(this->attribute_data_).
                     super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0x140);
    pMVar6 = pMVar5;
    if (pMVar5 <= pMVar10) {
LAB_0012691b:
      pMVar7 = &this->pos_encoding_data_;
      if (pMVar10 < pMVar5) {
        pMVar7 = pMVar6;
      }
      return pMVar7;
    }
    iVar8 = pAVar1[(long)pMVar10].decoder_id;
    if (-1 < (long)iVar8) {
      puVar2 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.attributes_decoders_.
               super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (iVar8 < (int)((ulong)((long)(this->decoder_->super_MeshDecoder).super_PointCloudDecoder.
                                      attributes_decoders_.
                                      super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >>
                       3)) {
        _Var3._M_t.
        super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
        .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
             puVar2[iVar8]._M_t.
             super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
             ._M_t;
        iVar8 = 0;
        while( true ) {
          iVar4 = (**(code **)(*(long *)_Var3._M_t.
                                        super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                        .
                                        super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>
                                        ._M_head_impl + 0x30))
                            (_Var3._M_t.
                             super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                             .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                             _M_head_impl);
          if (iVar4 <= iVar8) break;
          iVar4 = (**(code **)(*(long *)_Var3._M_t.
                                        super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                        .
                                        super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>
                                        ._M_head_impl + 0x28))
                            (_Var3._M_t.
                             super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                             .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                             _M_head_impl,iVar8);
          iVar8 = iVar8 + 1;
          if (iVar4 == att_id) {
            pMVar6 = &(this->attribute_data_).
                      super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)pMVar10].encoding_data;
            goto LAB_0012691b;
          }
        }
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

const MeshAttributeIndicesEncodingData *
MeshEdgebreakerDecoderImpl<TraversalDecoder>::GetAttributeEncodingData(
    int att_id) const {
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    const int decoder_id = attribute_data_[i].decoder_id;
    if (decoder_id < 0 || decoder_id >= decoder_->num_attributes_decoders()) {
      continue;
    }
    const AttributesDecoderInterface *const dec =
        decoder_->attributes_decoder(decoder_id);
    for (int j = 0; j < dec->GetNumAttributes(); ++j) {
      if (dec->GetAttributeId(j) == att_id) {
        return &attribute_data_[i].encoding_data;
      }
    }
  }
  return &pos_encoding_data_;
}